

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void Hex::Hexdumper<unsigned_char>::output_hex
               (ostream *os,uchar *first,uchar *last,char filler,int numberbase,bool showbase,
               bool uppercasehex)

{
  remove_const_t<unsigned_char> val;
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  uchar *puVar4;
  
  puVar4 = first;
  do {
    if (last <= puVar4) {
      return;
    }
    if (first < puVar4 && filler != '\0') {
      std::operator<<(os,filler);
    }
    val = *puVar4;
    std::operator<<(os,0x30);
    if (showbase) {
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x200;
    }
    if (uppercasehex) {
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x4000;
    }
    uVar3 = 2;
    if ((numberbase == 2) || (numberbase == 8)) {
LAB_001055f7:
      lVar1 = *(long *)os;
      *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = uVar3;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xffffffb5 | numberbase;
    }
    else if (numberbase == 0x40) {
      uVar3 = 3;
      goto LAB_001055f7;
    }
    bVar2 = Hexdumper_base::getbin(os);
    if (bVar2) {
      if (showbase) {
        std::operator<<(os,"0b");
      }
      *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
      output_bin(os,val);
    }
    else {
      output_hex_int<unsigned_char>(os,val);
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

static void output_hex(std::ostream& os, const T*first, const T*last, char filler, int numberbase, bool showbase, bool uppercasehex)
    {
        const T* p = first;
        while (p < last)
        {
            if (filler && p > first)
                os << filler;
            auto val = *p;
            os << std::setfill('0');
            if (showbase)
                os << std::showbase;
            if (uppercasehex)
                os << std::uppercase;

            if (numberbase==os.hex) {
                os << std::setw(sizeof(T)*2);
                os << std::hex;
            }
            else if (numberbase==os.oct) {
                os << std::setw((sizeof(T)*8+2)/3);
                os << std::oct;
            }
            else if (numberbase==os.dec) {
                os << std::setw(sizeof(T)*2);
                os << std::dec;
            }

            if (getbin(os)) {
                if (showbase)
                    os << "0b";
                os << std::setw(sizeof(T)*8);
                output_bin(os, val);
            }
            else {
                output_hex_int(os, val);
            }

            ++p;
        }
    }